

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  float *scanline;
  undefined2 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  byte bVar9;
  ImFontConfig *pIVar10;
  ImFont *pIVar11;
  ImFontAtlas *pIVar12;
  ushort *puVar13;
  uchar *puVar14;
  long lVar15;
  short sVar16;
  size_t sz;
  undefined1 auVar17 [15];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [16];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  unkbyte10 Var32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [16];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [14];
  uint6 uVar40;
  undefined4 uVar41;
  ushort uVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  stbtt__active_edge *z;
  void *ptr;
  ImWchar *pIVar54;
  stbrp_context *context;
  stbrp_node *ptr_00;
  uchar *puVar55;
  void *pvVar56;
  stbtt__edge *psVar57;
  float *pfVar58;
  stbtt__active_edge *psVar59;
  stbtt__active_edge *psVar60;
  undefined8 *puVar61;
  float *pfVar62;
  Glyph *pGVar63;
  bool bVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  stbtt__active_edge *psVar68;
  Glyph *pGVar69;
  int iVar70;
  long lVar71;
  long lVar72;
  size_t sz_00;
  bool bVar73;
  int iVar74;
  stbtt_fontinfo *psVar75;
  uchar uVar76;
  int iVar77;
  long lVar78;
  stbrp_rect *rects;
  void *pvVar79;
  long lVar80;
  stbtt__edge *psVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  byte *pbVar85;
  long lVar86;
  int iVar87;
  stbtt__edge *psVar88;
  int iVar89;
  ImFontConfig *pIVar90;
  ulong uVar91;
  long lVar92;
  stbrp_coord *psVar93;
  byte *pbVar94;
  uint uVar95;
  void *p;
  stbtt__active_edge *psVar96;
  void *pvVar97;
  uint uVar98;
  float fVar99;
  stbtt_uint8 *data;
  bool bVar100;
  byte bVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  char cVar109;
  char cVar110;
  float fVar112;
  undefined1 auVar105 [16];
  char cVar111;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ushort uVar113;
  ushort uVar118;
  float fVar114;
  short sVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  ushort uVar122;
  ushort uVar123;
  undefined1 in_XMM2 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar124;
  float fVar125;
  undefined1 in_XMM3 [16];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  float y0_2;
  int y0;
  int ix0;
  int x1;
  ImVector<stbrp_rect> extra_rects;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  int local_4cc;
  ulong local_4b8;
  float local_4ac;
  undefined8 *local_4a8;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  void *local_3f8;
  undefined8 uStack_3f0;
  stbtt_fontinfo *local_3e0;
  long local_3d8;
  uint local_3d0;
  uint local_3cc;
  undefined8 local_3c8;
  stbtt_pack_context local_3c0;
  undefined1 local_388 [16];
  ImVector<stbrp_rect> local_378;
  void *local_360;
  void *local_358;
  void *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  uint local_32c;
  uint local_328;
  int local_324;
  int local_320;
  float local_31c;
  float *local_318;
  long local_310;
  uchar *local_308;
  long local_300;
  float local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  long local_2e8;
  stbtt__edge *local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  short *local_2a0;
  long local_298;
  int local_290;
  int local_28c;
  ulong local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  ulong local_238;
  int local_230;
  
  local_408._8_8_ = local_408._0_8_;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  iVar74 = 0;
  this->TexID = (void *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  ptr = ImGui::MemAlloc((long)(this->ConfigData).Size * 0x50);
  local_408._0_8_ = SEXT48((this->ConfigData).Size);
  if ((long)local_408._0_8_ < 1) {
    uVar51 = 0x200;
    if (0 < this->TexDesiredWidth) {
      uVar51 = this->TexDesiredWidth;
    }
    iVar74 = 0;
    iVar77 = 0;
  }
  else {
    pIVar10 = (this->ConfigData).Data;
    uVar83 = 0;
    bVar100 = false;
    iVar77 = 0;
    do {
      pIVar11 = pIVar10[uVar83].DstFont;
      if ((pIVar11 == (ImFont *)0x0) ||
         (pIVar12 = pIVar11->ContainerAtlas, pIVar12 != this && pIVar12 != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x4f9,"bool ImFontAtlas::Build()");
      }
      pIVar90 = pIVar10 + uVar83;
      pbVar94 = (byte *)pIVar90->FontData;
      iVar70 = pIVar90->FontNo;
      bVar101 = *pbVar94;
      if (bVar101 < 0x4f) {
        if (bVar101 == 0) {
          if (pbVar94[1] != 1) goto LAB_0014426e;
        }
        else if ((bVar101 != 0x31) || (pbVar94[1] != 0)) goto LAB_0014426e;
        if ((pbVar94[2] != 0) || (pbVar94[3] != 0)) goto LAB_0014426e;
LAB_00141834:
        sVar50 = -(uint)(iVar70 != 0);
      }
      else {
        if (bVar101 == 0x4f) {
          if (((pbVar94[1] != 0x54) || (pbVar94[2] != 0x54)) || (pbVar94[3] != 0x4f))
          goto LAB_0014426e;
          goto LAB_00141834;
        }
        if (bVar101 != 0x74) goto LAB_0014426e;
        if (pbVar94[1] != 0x74) {
          if (((pbVar94[1] != 0x79) || (pbVar94[2] != 0x70)) || (pbVar94[3] != 0x31))
          goto LAB_0014426e;
          goto LAB_00141834;
        }
        if ((pbVar94[2] != 99) || (pbVar94[3] != 0x66)) goto LAB_0014426e;
        uVar51 = *(uint *)(pbVar94 + 4);
        uVar51 = uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8 | uVar51 << 0x18
        ;
        if (((uVar51 != 0x20000) && (uVar51 != 0x10000)) ||
           (uVar51 = *(uint *)(pbVar94 + 8),
           (int)(uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8 | uVar51 << 0x18
                ) <= iVar70)) goto LAB_0014426e;
        uVar51 = *(uint *)(pbVar94 + (long)iVar70 * 4 + 0xc);
        sVar50 = uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8 | uVar51 << 0x18
        ;
      }
      if ((int)sVar50 < 0) {
LAB_0014426e:
        __assert_fail("font_offset >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x4fb,"bool ImFontAtlas::Build()");
      }
      *(byte **)((long)ptr + uVar83 * 0x50 + 8) = pbVar94;
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x10) = sVar50;
      sVar43 = stbtt__find_table(pbVar94,sVar50,"cmap");
      sVar44 = stbtt__find_table(pbVar94,sVar50,"loca");
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x18) = sVar44;
      sVar45 = stbtt__find_table(pbVar94,sVar50,"head");
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x1c) = sVar45;
      sVar46 = stbtt__find_table(pbVar94,sVar50,"glyf");
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x20) = sVar46;
      sVar47 = stbtt__find_table(pbVar94,sVar50,"hhea");
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x24) = sVar47;
      sVar48 = stbtt__find_table(pbVar94,sVar50,"hmtx");
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x28) = sVar48;
      sVar49 = stbtt__find_table(pbVar94,sVar50,"kern");
      *(stbtt_uint32 *)((long)ptr + uVar83 * 0x50 + 0x2c) = sVar49;
      if (sVar43 == 0) {
        return bVar100;
      }
      if (sVar44 == 0) {
        return bVar100;
      }
      if (sVar45 == 0) {
        return bVar100;
      }
      if (sVar46 == 0) {
        return bVar100;
      }
      if (sVar47 == 0) {
        return bVar100;
      }
      if (sVar48 == 0) {
        return bVar100;
      }
      sVar50 = stbtt__find_table(pbVar94,sVar50,"maxp");
      if (sVar50 == 0) {
        uVar51 = 0xffff;
      }
      else {
        uVar51 = (uint)(ushort)(*(ushort *)(pbVar94 + (ulong)sVar50 + 4) << 8 |
                               *(ushort *)(pbVar94 + (ulong)sVar50 + 4) >> 8);
      }
      *(uint *)((long)ptr + uVar83 * 0x50 + 0x14) = uVar51;
      uVar42 = *(ushort *)(pbVar94 + (ulong)sVar43 + 2) << 8 |
               *(ushort *)(pbVar94 + (ulong)sVar43 + 2) >> 8;
      *(undefined4 *)((long)ptr + uVar83 * 0x50 + 0x30) = 0;
      if (uVar42 == 0) {
        return bVar100;
      }
      uVar51 = sVar43 + 4;
      uVar67 = (ulong)uVar42;
      iVar70 = 0;
      do {
        uVar42 = *(ushort *)(pbVar94 + uVar51) << 8 | *(ushort *)(pbVar94 + uVar51) >> 8;
        if ((uVar42 == 0) ||
           ((uVar42 == 3 &&
            ((uVar42 = *(ushort *)(pbVar94 + (ulong)uVar51 + 2) << 8 |
                       *(ushort *)(pbVar94 + (ulong)uVar51 + 2) >> 8, uVar42 == 10 || (uVar42 == 1))
            )))) {
          uVar52 = *(uint *)(pbVar94 + (ulong)uVar51 + 4);
          iVar70 = (uVar52 >> 0x18 | (uVar52 & 0xff0000) >> 8 | (uVar52 & 0xff00) << 8 |
                   uVar52 << 0x18) + sVar43;
          *(int *)((long)ptr + uVar83 * 0x50 + 0x30) = iVar70;
        }
        uVar51 = uVar51 + 8;
        uVar67 = uVar67 - 1;
      } while (uVar67 != 0);
      if (iVar70 == 0) {
        return bVar100;
      }
      *(uint *)((long)ptr + uVar83 * 0x50 + 0x34) =
           (uint)(ushort)(*(ushort *)(pbVar94 + (long)(int)sVar45 + 0x32) << 8 |
                         *(ushort *)(pbVar94 + (long)(int)sVar45 + 0x32) >> 8);
      pIVar54 = pIVar90->GlyphRanges;
      if (pIVar54 == (ushort *)0x0) {
        pIVar54 = GetGlyphRangesDefault::ranges;
        pIVar90->GlyphRanges = GetGlyphRangesDefault::ranges;
      }
      uVar42 = *pIVar54;
      while (uVar42 != 0) {
        if (pIVar54[1] == 0) break;
        iVar74 = (iVar74 - (uint)uVar42) + (uint)pIVar54[1] + 1;
        iVar77 = iVar77 + 1;
        uVar42 = pIVar54[2];
        pIVar54 = pIVar54 + 2;
      }
      uVar83 = uVar83 + 1;
      bVar100 = (ulong)local_408._0_8_ <= uVar83;
    } while (uVar83 != local_408._0_8_);
    uVar51 = this->TexDesiredWidth;
    if ((((int)uVar51 < 1) && (uVar51 = 0x1000, iVar74 < 0xfa1)) && (uVar51 = 0x800, iVar74 < 0x7d1)
       ) {
      uVar51 = (uint)(1000 < iVar74) * 0x200 + 0x200;
    }
  }
  this->TexWidth = uVar51;
  this->TexHeight = 0;
  context = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar52 = uVar51 - 1;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((ulong)uVar52 << 4);
  auVar117 = _DAT_0015f2b0;
  if ((context == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
    auVar117 = in_XMM2;
    if (context != (stbrp_context *)0x0) {
      ImGui::MemFree(context);
      auVar117 = in_XMM2;
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
  }
  else {
    local_3c0.user_allocator_context = (void *)0x0;
    local_3c0.height = 0x8000;
    local_3c0.pixels = (uchar *)0x0;
    local_3c0.padding = 1;
    local_3c0.h_oversample = 1;
    local_3c0.v_oversample = 1;
    local_3c0.pack_info = context;
    local_3c0.width = uVar51;
    local_3c0.stride_in_bytes = uVar51;
    local_3c0.nodes = ptr_00;
    if (0x10000 < uVar51) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_rect_pack.h"
                    ,0xf2,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar83 = (ulong)(uVar51 - 2);
    if (uVar51 < 3) {
      uVar83 = 0;
      auVar117 = in_XMM2;
    }
    else {
      lVar78 = uVar83 - 1;
      auVar105._8_4_ = (int)lVar78;
      auVar105._0_8_ = lVar78;
      auVar105._12_4_ = (int)((ulong)lVar78 >> 0x20);
      lVar78 = 0;
      auVar105 = auVar105 ^ _DAT_0015f2b0;
      in_XMM3._8_4_ = 0xffffffff;
      in_XMM3._0_8_ = 0xffffffffffffffff;
      in_XMM3._12_4_ = 0xffffffff;
      auVar106 = _DAT_0015f3b0;
      do {
        auVar128 = auVar106 ^ auVar117;
        auVar131._0_4_ = -(uint)(auVar105._0_4_ < auVar128._0_4_);
        auVar131._4_4_ = -(uint)(auVar105._4_4_ < auVar128._4_4_);
        auVar131._8_4_ = -(uint)(auVar105._8_4_ < auVar128._8_4_);
        auVar131._12_4_ = -(uint)(auVar105._12_4_ < auVar128._12_4_);
        auVar129._4_4_ = -(uint)(auVar128._4_4_ == auVar105._4_4_);
        auVar129._12_4_ = -(uint)(auVar128._12_4_ == auVar105._12_4_);
        auVar129._0_4_ = auVar129._4_4_;
        auVar129._8_4_ = auVar129._12_4_;
        auVar128._4_4_ = auVar131._4_4_;
        auVar128._0_4_ = auVar131._4_4_;
        auVar128._8_4_ = auVar131._12_4_;
        auVar128._12_4_ = auVar131._12_4_;
        auVar128 = auVar128 | auVar129 & auVar131;
        lVar71 = auVar106._8_8_;
        if ((~auVar128._0_4_ & 1) != 0) {
          *(stbrp_node **)((long)&ptr_00->next + lVar78) = ptr_00 + auVar106._0_8_ + 1;
        }
        if (((auVar128 ^ in_XMM3) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(stbrp_node **)((long)&ptr_00[1].next + lVar78) = ptr_00 + (lVar71 - in_XMM3._8_8_);
        }
        auVar106._0_8_ = auVar106._0_8_ + 2;
        auVar106._8_8_ = lVar71 + 2;
        lVar78 = lVar78 + 0x20;
      } while ((ulong)(uVar51 - 1 >> 1) << 5 != lVar78);
    }
    ptr_00[uVar83].next = (stbrp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = ptr_00;
    context->active_head = context->extra;
    context->width = uVar52;
    context->height = 0x7fff;
    context->num_nodes = uVar52;
    context->align = (int)((uVar51 - 2) + uVar52) / (int)uVar52;
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = (stbrp_coord)uVar52;
    context->extra[1].y = 0xffff;
    context->extra[1].next = (stbrp_node *)0x0;
  }
  local_378.Size = 0;
  local_378.Capacity = 0;
  local_378.Data = (stbrp_rect *)0x0;
  RenderCustomTexData(this,0,&local_378);
  local_3c0.h_oversample = 1;
  local_3c0.v_oversample = 1;
  if (local_378.Size < 1) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x35b,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
  }
  stbrp_pack_rects(context,local_378.Data,local_378.Size);
  if (0 < (long)local_378.Size) {
    iVar70 = this->TexHeight;
    lVar78 = 0;
    do {
      if (*(int *)((long)&(local_378.Data)->was_packed + lVar78) != 0) {
        iVar87 = (uint)*(ushort *)((long)&(local_378.Data)->h + lVar78) +
                 (uint)*(ushort *)((long)&(local_378.Data)->y + lVar78);
        if (iVar70 <= iVar87) {
          iVar70 = iVar87;
        }
        this->TexHeight = iVar70;
      }
      lVar78 = lVar78 + 0x10;
    } while ((long)local_378.Size * 0x10 != lVar78);
  }
  sz = (long)iVar74 * 0x1c;
  local_358 = ImGui::MemAlloc(sz);
  sz_00 = (long)iVar74 << 4;
  local_350 = ImGui::MemAlloc(sz_00);
  local_360 = ImGui::MemAlloc((long)iVar77 * 0x28);
  pvVar97 = local_358;
  local_4b8._0_4_ = 0;
  memset(local_358,0,sz);
  memset(local_350,0,sz_00);
  pvVar56 = local_360;
  memset(local_360,0,(long)iVar77 * 0x28);
  iVar70 = 0;
  local_4cc = 0;
  if (0 < (this->ConfigData).Size) {
    pvVar79 = (void *)0x0;
    local_4cc = 0;
    iVar70 = 0;
    local_4b8 = 0;
    do {
      uVar83 = local_4b8;
      pIVar10 = (this->ConfigData).Data;
      psVar75 = (stbtt_fontinfo *)((long)pvVar79 * 0x50 + (long)ptr);
      puVar13 = pIVar10[(long)pvVar79].GlyphRanges;
      uVar42 = *puVar13;
      if (uVar42 == 0) {
        psVar75[1].data = (uchar *)((long)pvVar56 + (local_4b8 & 0xffffffff) * 0x28);
        psVar75[1].fontstart = 0;
        iVar87 = 0;
      }
      else {
        uVar67 = 0;
        iVar87 = 0;
        do {
          if (puVar13[uVar67 * 2 + 1] == 0) {
            psVar75[1].data = (uchar *)((long)pvVar56 + (local_4b8 & 0xffffffff) * 0x28);
            psVar75[1].fontstart = (int)uVar67;
            local_4b8 = (local_4b8 & 0xffffffff) + uVar67;
            if ((int)uVar67 == 0) goto LAB_00141fb8;
            goto LAB_00141f51;
          }
          iVar87 = (iVar87 - (uint)uVar42) + (uint)puVar13[uVar67 * 2 + 1] + 1;
          uVar42 = puVar13[uVar67 * 2 + 2];
          uVar67 = uVar67 + 1;
        } while (uVar42 != 0);
        psVar75[1].data = (uchar *)((long)pvVar56 + (local_4b8 & 0xffffffff) * 0x28);
        psVar75[1].fontstart = (int)uVar67;
        local_4b8 = (ulong)(uint)((int)local_4b8 + (int)uVar67);
LAB_00141f51:
        fVar104 = pIVar10[(long)pvVar79].SizePixels;
        pfVar58 = (float *)((long)pvVar56 + (uVar83 & 0xffffffff) * 0x28);
        uVar83 = 0;
        do {
          *pfVar58 = fVar104;
          uVar42 = puVar13[uVar83 * 2];
          pfVar58[1] = (float)(uint)uVar42;
          iVar89 = (uint)puVar13[uVar83 * 2 + 1] - (uint)uVar42;
          pfVar58[4] = (float)(iVar89 + 1);
          *(void **)(pfVar58 + 6) = (void *)((long)local_4cc * 0x1c + (long)pvVar97);
          local_4cc = iVar89 + local_4cc + 1;
          uVar83 = uVar83 + 1;
          pfVar58 = pfVar58 + 10;
        } while ((uVar67 & 0xffffffff) != uVar83);
      }
LAB_00141fb8:
      local_3d8 = CONCAT44(local_3d8._4_4_,iVar70);
      psVar75[1].userdata = (void *)((long)iVar70 * 0x10 + (long)local_350);
      local_3f8 = pvVar79;
      stbtt_PackSetOversampling
                (&local_3c0,pIVar10[(long)pvVar79].OversampleH,pIVar10[(long)pvVar79].OversampleV);
      uVar4 = local_3c0._32_8_;
      rects = (stbrp_rect *)psVar75[1].userdata;
      iVar70 = psVar75[1].fontstart;
      if ((long)iVar70 < 1) {
        uVar83 = 0;
      }
      else {
        puVar55 = psVar75[1].data;
        uVar91 = local_3c0._32_8_ & 0xffffffff;
        uVar67 = (ulong)local_3c0._32_8_ >> 0x20;
        local_408._0_8_ = uVar67;
        sVar119 = (short)local_3c0.v_oversample;
        sVar16 = (short)local_3c0.padding;
        lVar78 = 0;
        uVar83 = 0;
        local_388._0_8_ = puVar55;
        do {
          fVar104 = *(float *)(puVar55 + lVar78 * 0x28);
          if (fVar104 <= 0.0) {
            fVar104 = -fVar104;
            uVar51 = (uint)(ushort)(*(ushort *)(psVar75->data + (long)psVar75->head + 0x12) << 8 |
                                   *(ushort *)(psVar75->data + (long)psVar75->head + 0x12) >> 8);
          }
          else {
            puVar14 = psVar75->data;
            lVar71 = (long)psVar75->hhea;
            uVar51 = ((int)(short)((ushort)puVar14[lVar71 + 4] << 8) | (uint)puVar14[lVar71 + 5]) -
                     ((int)(short)((ushort)puVar14[lVar71 + 6] << 8) | (uint)puVar14[lVar71 + 7]);
          }
          puVar55[lVar78 * 0x28 + 0x20] = (uchar)uVar91;
          puVar55[lVar78 * 0x28 + 0x21] = local_408[0];
          if (0 < *(int *)(puVar55 + lVar78 * 0x28 + 0x10)) {
            psVar93 = &rects[(int)uVar83].h;
            lVar71 = 0;
            do {
              iVar89 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar75->data,psVar75->index_map);
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar75,iVar89,(fVar104 / (float)(int)uVar51) * (float)uVar91,
                         (fVar104 / (float)(int)uVar51) * (float)uVar67,auVar117._0_4_,in_XMM3._0_4_
                         ,(int *)&local_238,(int *)local_418,(int *)&local_3c8,
                         (int *)(local_418 + 0xc));
              psVar93[-1] = ((((short)(int)local_3c8 + (short)uVar4) - (short)local_238) + sVar16) -
                            1;
              *psVar93 = ~(ushort)local_418._0_8_ + (short)local_418._12_4_ + sVar119 + sVar16;
              lVar71 = lVar71 + 1;
              psVar93 = psVar93 + 8;
            } while (lVar71 < *(int *)(puVar55 + lVar78 * 0x28 + 0x10));
            uVar83 = (ulong)(uint)((int)uVar83 + (int)lVar71);
            puVar55 = (uchar *)local_388._0_8_;
          }
          lVar78 = lVar78 + 1;
        } while (lVar78 != iVar70);
        rects = (stbrp_rect *)psVar75[1].userdata;
        pvVar97 = local_358;
        pvVar56 = local_360;
      }
      stbrp_pack_rects((stbrp_context *)local_3c0.pack_info,rects,(int)uVar83);
      if (0 < (int)uVar83) {
        iVar70 = this->TexHeight;
        pvVar79 = psVar75[1].userdata;
        lVar78 = 0;
        do {
          if (*(int *)((long)pvVar79 + lVar78 + 0xc) != 0) {
            iVar89 = (uint)*(ushort *)((long)pvVar79 + lVar78 + 6) +
                     (uint)*(ushort *)((long)pvVar79 + lVar78 + 10);
            if (iVar70 <= iVar89) {
              iVar70 = iVar89;
            }
            this->TexHeight = iVar70;
          }
          lVar78 = lVar78 + 0x10;
        } while (uVar83 << 4 != lVar78);
      }
      iVar70 = iVar87 + (int)(float)local_3d8;
      pvVar79 = (void *)((long)local_3f8 + 1);
    } while ((long)pvVar79 < (long)(this->ConfigData).Size);
  }
  if (iVar70 != iVar74) {
    __assert_fail("buf_rects_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x54b,"bool ImFontAtlas::Build()");
  }
  if (local_4cc != iVar74) {
    __assert_fail("buf_packedchars_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x54c,"bool ImFontAtlas::Build()");
  }
  if ((int)local_4b8 != iVar77) {
    __assert_fail("buf_ranges_n == total_glyph_range_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x54d,"bool ImFontAtlas::Build()");
  }
  uVar51 = this->TexHeight - 1;
  uVar51 = (int)uVar51 >> 1 | uVar51;
  uVar51 = (int)uVar51 >> 2 | uVar51;
  uVar51 = (int)uVar51 >> 4 | uVar51;
  uVar51 = (int)uVar51 >> 8 | uVar51;
  lVar78 = (long)(int)((int)uVar51 >> 0x10 | uVar51) + 1;
  this->TexHeight = (int)lVar78;
  puVar55 = (uchar *)ImGui::MemAlloc(this->TexWidth * lVar78);
  this->TexPixelsAlpha8 = puVar55;
  memset(puVar55,0,(long)this->TexHeight * (long)this->TexWidth);
  local_3c0.pixels = this->TexPixelsAlpha8;
  local_3c0.height = this->TexHeight;
  if (0 < (this->ConfigData).Size) {
    lVar78 = 0;
    uVar83 = local_3c0._32_8_;
    do {
      local_3c0._32_8_ = uVar83;
      pIVar10 = (this->ConfigData).Data;
      lVar71 = lVar78 * 0x50;
      local_3e0 = (stbtt_fontinfo *)((long)ptr + lVar71);
      local_2e8 = lVar78;
      stbtt_PackSetOversampling(&local_3c0,pIVar10[lVar78].OversampleH,pIVar10[lVar78].OversampleV);
      local_2d0 = (long)*(int *)((long)ptr + lVar71 + 0x48);
      local_288._0_4_ = local_3c0.h_oversample;
      local_288._4_4_ = local_3c0.v_oversample;
      uStack_280 = 0;
      if (0 < local_2d0) {
        lVar78 = *(long *)((long)ptr + lVar71 + 0x38);
        lVar71 = *(long *)((long)ptr + lVar71 + 0x40);
        lVar92 = 0;
        lVar80 = 0;
        local_310 = lVar78;
        local_2d8 = lVar71;
        do {
          local_2f8 = *(float *)(lVar71 + lVar92 * 0x28);
          if (local_2f8 <= 0.0) {
            uStack_2f4 = 0x80000000;
            uStack_2f0 = 0x80000000;
            uStack_2ec = 0x80000000;
            local_2f8 = -local_2f8;
            uVar51 = (uint)(ushort)(*(ushort *)(local_3e0->data + (long)local_3e0->head + 0x12) << 8
                                   | *(ushort *)(local_3e0->data + (long)local_3e0->head + 0x12) >>
                                     8);
          }
          else {
            puVar55 = local_3e0->data;
            lVar72 = (long)local_3e0->hhea;
            uVar51 = ((int)(short)((ushort)puVar55[lVar72 + 4] << 8) | (uint)puVar55[lVar72 + 5]) -
                     ((int)(short)((ushort)puVar55[lVar72 + 6] << 8) | (uint)puVar55[lVar72 + 7]);
            uStack_2f4 = 0;
            uStack_2f0 = 0;
            uStack_2ec = 0;
          }
          local_2f8 = local_2f8 / (float)(int)uVar51;
          lVar72 = lVar71 + lVar92 * 0x28;
          uVar83 = *(ulong *)(lVar72 + 0x20);
          auVar17._8_6_ = 0;
          auVar17._0_8_ = uVar83;
          auVar17[0xe] = (char)(uVar83 >> 0x38);
          auVar19._8_4_ = 0;
          auVar19._0_8_ = uVar83;
          auVar19[0xc] = (char)(uVar83 >> 0x30);
          auVar19._13_2_ = auVar17._13_2_;
          auVar20._8_4_ = 0;
          auVar20._0_8_ = uVar83;
          auVar20._12_3_ = auVar19._12_3_;
          auVar21._8_2_ = 0;
          auVar21._0_8_ = uVar83;
          auVar21[10] = (char)(uVar83 >> 0x28);
          auVar21._11_4_ = auVar20._11_4_;
          auVar22._8_2_ = 0;
          auVar22._0_8_ = uVar83;
          auVar22._10_5_ = auVar21._10_5_;
          auVar24[8] = (char)(uVar83 >> 0x20);
          auVar24._0_8_ = uVar83;
          auVar24._9_6_ = auVar22._9_6_;
          auVar27._7_8_ = 0;
          auVar27._0_7_ = auVar24._8_7_;
          cVar111 = (char)(uVar83 >> 0x18);
          Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),cVar111);
          auVar37._9_6_ = 0;
          auVar37._0_9_ = Var28;
          cVar110 = (char)(uVar83 >> 0x10);
          auVar29._1_10_ = SUB1510(auVar37 << 0x30,5);
          auVar29[0] = cVar110;
          auVar38._11_4_ = 0;
          auVar38._0_11_ = auVar29;
          cVar109 = (char)(uVar83 >> 8);
          auVar30._1_12_ = SUB1512(auVar38 << 0x20,3);
          auVar30[0] = cVar109;
          bVar101 = (byte)uVar83;
          uVar42 = CONCAT11(0,bVar101);
          auVar25._2_13_ = auVar30;
          auVar25._0_2_ = uVar42;
          sVar119 = (short)Var28;
          auVar18._10_2_ = 0;
          auVar18._0_10_ = auVar25._0_10_;
          auVar18._12_2_ = sVar119;
          uVar40 = CONCAT42(auVar18._10_4_,auVar29._0_2_);
          auVar31._6_8_ = 0;
          auVar31._0_6_ = uVar40;
          uVar113 = auVar30._0_2_;
          Var32 = CONCAT82(SUB148(auVar31 << 0x40,6),uVar113);
          auVar23._4_10_ = Var32;
          auVar23._0_4_ = CONCAT22(0,uVar42);
          local_3c0._32_8_ = auVar23._0_8_;
          iVar74 = *(int *)(lVar72 + 0x10);
          if (0 < iVar74) {
            auVar115._0_4_ = (float)CONCAT22(0,uVar42);
            auVar115._4_4_ = (float)(int)Var32;
            auVar115._8_4_ = (float)(int)uVar40;
            auVar115._12_4_ = (float)(auVar18._10_4_ >> 0x10);
            local_258 = divps(_DAT_00164190,auVar115);
            auVar127[0] = -(bVar101 == 0);
            auVar127[1] = -(bVar101 == 0);
            auVar127[2] = -(bVar101 == 0);
            auVar127[3] = -(bVar101 == 0);
            auVar127[4] = -(cVar109 == '\0');
            auVar127[5] = -(cVar109 == '\0');
            auVar127[6] = -(cVar109 == '\0');
            auVar127[7] = -(cVar109 == '\0');
            auVar127[8] = -(cVar110 == '\0');
            auVar127[9] = -(cVar110 == '\0');
            auVar127[10] = -(cVar110 == '\0');
            auVar127[0xb] = -(cVar110 == '\0');
            auVar127[0xc] = -(cVar111 == '\0');
            auVar127[0xd] = -(cVar111 == '\0');
            auVar127[0xe] = -(cVar111 == '\0');
            auVar127[0xf] = -(cVar111 == '\0');
            sVar16 = -auVar29._0_2_;
            sVar119 = -sVar119;
            Var32 = CONCAT64(CONCAT42(CONCAT22(sVar119,sVar119),sVar16),CONCAT22(sVar16,sVar119));
            auVar33._4_8_ = (long)((unkuint10)Var32 >> 0x10);
            auVar33._2_2_ = 1 - uVar113;
            auVar33._0_2_ = 1 - uVar113;
            auVar120._0_4_ = (float)(int)(short)(1 - uVar42);
            auVar120._4_4_ = (float)(auVar33._0_4_ >> 0x10);
            auVar120._8_4_ = (float)((int)((unkuint10)Var32 >> 0x10) >> 0x10);
            auVar120._12_4_ = (float)(int)sVar119;
            auVar116._0_4_ = auVar115._0_4_ + auVar115._0_4_;
            auVar116._4_4_ = auVar115._4_4_ + auVar115._4_4_;
            auVar116._8_4_ = auVar115._8_4_ + auVar115._8_4_;
            auVar116._12_4_ = auVar115._12_4_ + auVar115._12_4_;
            local_248 = divps(auVar120,auVar116);
            local_248 = ~auVar127 & local_248;
            uVar67 = (ulong)uVar42;
            lVar80 = (long)(int)lVar80;
            uVar83 = (ulong)uVar113;
            auVar117._4_4_ = local_258._4_4_;
            auVar117._0_4_ = auVar117._4_4_;
            auVar117._8_4_ = auVar117._4_4_;
            auVar117._12_4_ = auVar117._4_4_;
            local_278 = local_248._4_4_;
            lVar86 = 0;
            local_340 = lVar72;
            local_2c8 = lVar92;
            fStack_274 = local_278;
            fStack_270 = local_278;
            fStack_26c = local_278;
            local_268 = auVar117;
            do {
              psVar75 = local_3e0;
              if (*(int *)(lVar78 + 0xc + lVar80 * 0x10) != 0) {
                lVar78 = lVar80 * 0x10 + lVar78;
                local_2a0 = (short *)(lVar86 * 0x1c + *(long *)(lVar72 + 0x18));
                local_300 = lVar86;
                local_298 = lVar80;
                iVar77 = stbtt_FindGlyphIndex
                                   ((stbtt_fontinfo *)local_3e0->data,local_3e0->index_map);
                uVar4 = *(undefined8 *)(lVar78 + 4);
                auVar106 = pshuflw(ZEXT416((uint)local_3c0.padding),ZEXT416((uint)local_3c0.padding)
                                   ,0);
                uVar113 = (short)uVar4 - auVar106._0_2_;
                uVar118 = (short)((ulong)uVar4 >> 0x10) - auVar106._2_2_;
                uVar122 = (short)((ulong)uVar4 >> 0x20) + auVar106._4_2_;
                uVar123 = (short)((ulong)uVar4 >> 0x30) + auVar106._6_2_;
                *(ushort *)(lVar78 + 4) = uVar113;
                *(ushort *)(lVar78 + 6) = uVar118;
                *(ushort *)(lVar78 + 8) = uVar122;
                *(ushort *)(lVar78 + 10) = uVar123;
                puVar55 = psVar75->data;
                uVar42 = *(ushort *)(puVar55 + (long)psVar75->hhea + 0x22) << 8 |
                         *(ushort *)(puVar55 + (long)psVar75->hhea + 0x22) >> 8;
                iVar74 = psVar75->hmtx;
                lVar71 = (ulong)uVar42 * 4 + (long)iVar74 + -4;
                lVar80 = (ulong)uVar42 * 4 + (long)iVar74 + -3;
                if (iVar77 < (int)(uint)uVar42) {
                  lVar71 = (long)(iVar77 * 4) + (long)iVar74;
                  lVar80 = (long)(iVar77 * 4) + 1 + (long)iVar74;
                }
                local_32c = (uint)puVar55[lVar80];
                local_328 = (uint)puVar55[lVar71];
                fVar102 = (float)uVar67 * local_2f8;
                fVar114 = (float)uVar83 * local_2f8;
                fVar104 = local_2f8;
                local_338 = lVar78;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar75,iVar77,fVar102,fVar114,local_2f8,auVar117._0_4_,&local_320,
                           &local_324,&local_28c,&local_290);
                local_308 = local_3c0.pixels + uVar122;
                local_3cc = local_3c0.stride_in_bytes;
                uVar51 = stbtt_GetGlyphShape(psVar75,iVar77,(stbtt_vertex **)&local_3c8);
                uVar52 = (uint)uVar113 - (int)uVar67;
                uVar98 = uVar52 + 1;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_3e0,iVar77,fVar102,fVar114,fVar104,auVar117._0_4_,
                           (int *)(local_418 + 0xc),(int *)&local_31c,(int *)0x0,(int *)0x0);
                uVar41 = local_418._12_4_;
                if (uVar98 != 0) {
                  local_3d0 = (uint)uVar118 - (int)uVar83;
                  iVar74 = local_3d0 + 1;
                  if ((iVar74 != 0) && (0 < (int)uVar51)) {
                    local_308 = local_308 + (int)(uVar123 * local_3cc);
                    lVar78 = CONCAT44(local_3c8._4_4_,(int)local_3c8);
                    local_418._8_4_ = local_31c;
                    fVar104 = fVar114;
                    if (fVar102 <= fVar114) {
                      fVar104 = fVar102;
                    }
                    lVar71 = 0;
                    uVar53 = 0;
                    do {
                      uVar53 = uVar53 + (*(char *)(lVar78 + 8 + lVar71) == '\x01');
                      lVar71 = lVar71 + 10;
                    } while ((ulong)uVar51 * 10 != lVar71);
                    if (uVar53 != 0) {
                      uVar83 = (ulong)uVar53;
                      local_3f8 = ImGui::MemAlloc(uVar83 * 4);
                      if (local_3f8 != (void *)0x0) {
                        bVar64 = false;
                        fVar99 = 0.0;
                        auVar34._8_8_ = 0;
                        auVar34._0_8_ = local_408._8_8_;
                        local_408 = auVar34 << 0x40;
                        fVar103 = 0.0;
                        bVar100 = true;
                        do {
                          bVar73 = bVar100;
                          if (bVar64) {
                            pvVar56 = ImGui::MemAlloc((long)(int)fVar103 << 3);
                            local_408._0_8_ = pvVar56;
                            if (pvVar56 == (void *)0x0) {
                              ImGui::MemFree((void *)0x0);
                              ImGui::MemFree(local_3f8);
                              goto LAB_0014355a;
                            }
                          }
                          local_238 = local_238 & 0xffffffff00000000;
                          fVar103 = 0.0;
                          fVar112 = 0.0;
                          uVar67 = 0xffffffff;
                          lVar71 = 0;
                          do {
                            cVar109 = *(char *)(lVar78 + 8 + lVar71);
                            if (cVar109 == '\x03') {
                              fVar124 = (float)(int)*(short *)(lVar78 + 6 + lVar71);
                              auVar117 = ZEXT416((uint)fVar124);
                              stbtt__tesselate_curve
                                        ((stbtt__point *)local_408._0_8_,(int *)&local_238,fVar103,
                                         fVar112,(float)(int)*(short *)(lVar78 + 4 + lVar71),fVar124
                                         ,(float)(int)*(short *)(lVar78 + lVar71),
                                         (float)(int)*(short *)(lVar78 + 2 + lVar71),
                                         (0.35 / fVar104) * (0.35 / fVar104),0);
                              auVar106 = pshuflw(ZEXT416(*(uint *)(lVar78 + lVar71)),
                                                 ZEXT416(*(uint *)(lVar78 + lVar71)),0x60);
                              fVar103 = (float)(auVar106._0_4_ >> 0x10);
                              fVar112 = (float)(auVar106._4_4_ >> 0x10);
                            }
                            else {
                              fVar124 = (float)local_238;
                              if (cVar109 == '\x02') {
                                lVar80 = (long)(int)(float)local_238;
                                auVar106 = pshuflw(ZEXT416(*(uint *)(lVar78 + lVar71)),
                                                   ZEXT416(*(uint *)(lVar78 + lVar71)),0x60);
                                fVar103 = (float)(auVar106._0_4_ >> 0x10);
                                fVar112 = (float)(auVar106._4_4_ >> 0x10);
                                local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
                                if ((stbtt__point *)local_408._0_8_ != (stbtt__point *)0x0) {
                                  ((stbtt__point *)(local_408._0_8_ + lVar80 * 8))->x = fVar103;
                                  ((stbtt__point *)(local_408._0_8_ + lVar80 * 8))->y = fVar112;
                                }
                              }
                              else if (cVar109 == '\x01') {
                                if (-1 < (int)uVar67) {
                                  *(int *)((long)local_3f8 + uVar67 * 4) =
                                       (int)(float)local_238 - (int)fVar99;
                                }
                                uVar67 = (ulong)((int)uVar67 + 1);
                                auVar106 = pshuflw(ZEXT416(*(uint *)(lVar78 + lVar71)),
                                                   ZEXT416(*(uint *)(lVar78 + lVar71)),0x60);
                                fVar103 = (float)(auVar106._0_4_ >> 0x10);
                                fVar112 = (float)(auVar106._4_4_ >> 0x10);
                                local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
                                fVar99 = fVar124;
                                if ((stbtt__point *)local_408._0_8_ != (stbtt__point *)0x0) {
                                  ((stbtt__point *)(local_408._0_8_ + (long)(int)fVar124 * 8))->x =
                                       fVar103;
                                  ((stbtt__point *)(local_408._0_8_ + (long)(int)fVar124 * 8))->y =
                                       fVar112;
                                }
                              }
                            }
                            lVar71 = lVar71 + 10;
                          } while ((ulong)uVar51 * 10 != lVar71);
                          *(int *)((long)local_3f8 + (long)(int)uVar67 * 4) =
                               (int)(float)local_238 - (int)fVar99;
                          bVar64 = true;
                          fVar103 = (float)local_238;
                          bVar100 = false;
                        } while (bVar73);
                        uVar4 = local_408._0_8_;
                        if ((void *)local_408._0_8_ != (void *)0x0) {
                          uVar67 = 0;
                          lVar78 = 0;
                          do {
                            lVar78 = (long)(int)lVar78 +
                                     (long)*(int *)((long)local_3f8 + uVar67 * 4);
                            uVar67 = uVar67 + 1;
                          } while (uVar83 != uVar67);
                          psVar57 = (stbtt__edge *)ImGui::MemAlloc(lVar78 * 0x14 + 0x14);
                          pvVar56 = (void *)uVar4;
                          if (psVar57 != (stbtt__edge *)0x0) {
                            uVar67 = 0;
                            uVar51 = 0;
                            iVar77 = 0;
                            pvVar97 = (void *)uVar4;
                            do {
                              iVar70 = *(int *)((long)local_3f8 + uVar67 * 4);
                              pvVar56 = pvVar97;
                              if (0 < iVar70) {
                                lVar78 = (long)iVar77;
                                uVar82 = (ulong)(iVar70 - 1);
                                uVar91 = 0;
                                iVar87 = iVar70;
                                do {
                                  iVar89 = (int)uVar82;
                                  fVar104 = *(float *)((long)pvVar97 +
                                                      (long)iVar89 * 8 + lVar78 * 8 + 4);
                                  fVar99 = *(float *)(uVar4 + uVar91 * 8 + lVar78 * 8 + 4);
                                  if ((fVar104 != fVar99) || (NAN(fVar104) || NAN(fVar99))) {
                                    iVar87 = (int)uVar91;
                                    if (fVar104 <= fVar99) {
                                      iVar87 = iVar89;
                                      iVar89 = (int)uVar91;
                                    }
                                    psVar57[(int)uVar51].invert = (uint)(fVar99 < fVar104);
                                    uVar5 = *(undefined8 *)
                                             ((long)pvVar97 + (long)iVar89 * 8 + lVar78 * 8);
                                    uVar6 = *(undefined8 *)
                                             ((long)pvVar97 + (long)iVar87 * 8 + lVar78 * 8);
                                    psVar81 = psVar57 + (int)uVar51;
                                    psVar81->x0 = (float)uVar5 * fVar102 + 0.0;
                                    psVar81->y0 = (float)((ulong)uVar5 >> 0x20) * -fVar114 + 0.0;
                                    psVar81->x1 = (float)uVar6 * fVar102 + 0.0;
                                    psVar81->y1 = (float)((ulong)uVar6 >> 0x20) * -fVar114 + 0.0;
                                    uVar51 = uVar51 + 1;
                                    iVar87 = *(int *)((long)local_3f8 + uVar67 * 4);
                                    pvVar56 = (void *)local_408._0_8_;
                                  }
                                  uVar82 = uVar91 & 0xffffffff;
                                  uVar91 = uVar91 + 1;
                                } while ((long)uVar91 < (long)iVar87);
                              }
                              iVar77 = iVar77 + iVar70;
                              uVar67 = uVar67 + 1;
                              pvVar97 = pvVar56;
                            } while (uVar67 != uVar83);
                            stbtt__sort_edges_quicksort(psVar57,uVar51);
                            if (1 < (int)uVar51) {
                              uVar83 = 1;
                              lVar78 = 2;
                              psVar81 = psVar57;
                              do {
                                uVar2 = psVar57[uVar83].x0;
                                uVar7 = psVar57[uVar83].y0;
                                local_230 = psVar57[uVar83].invert;
                                local_238._0_4_ = psVar57[uVar83].x1;
                                local_238._4_4_ = psVar57[uVar83].y1;
                                lVar71 = lVar78;
                                psVar88 = psVar81;
                                do {
                                  if (psVar88->y0 <= (float)uVar7) {
                                    uVar53 = (int)lVar71 - 1;
                                    goto LAB_00142b5d;
                                  }
                                  psVar88[1].invert = psVar88->invert;
                                  fVar104 = psVar88->y0;
                                  fVar102 = psVar88->x1;
                                  fVar114 = psVar88->y1;
                                  psVar88[1].x0 = psVar88->x0;
                                  psVar88[1].y0 = fVar104;
                                  psVar88[1].x1 = fVar102;
                                  psVar88[1].y1 = fVar114;
                                  lVar71 = lVar71 + -1;
                                  psVar88 = psVar88 + -1;
                                } while (1 < lVar71);
                                uVar53 = 0;
LAB_00142b5d:
                                if (uVar83 != uVar53) {
                                  psVar57[(int)uVar53].x0 = (float)uVar2;
                                  psVar57[(int)uVar53].y0 = (float)uVar7;
                                  psVar57[(int)uVar53].x1 = (float)local_238;
                                  psVar57[(int)uVar53].y1 = (float)local_238._4_4_;
                                  psVar57[(int)uVar53].invert = local_230;
                                }
                                uVar83 = uVar83 + 1;
                                lVar78 = lVar78 + 1;
                                psVar81 = psVar81 + 1;
                              } while (uVar83 != uVar51);
                            }
                            local_418._0_8_ = (stbtt__active_edge *)0x0;
                            pfVar58 = (float *)&local_238;
                            if (0x40 < (int)uVar98) {
                              pfVar58 = (float *)ImGui::MemAlloc((ulong)uVar98 * 8 + 4);
                            }
                            psVar57[(int)uVar51].y0 = (float)(iVar74 + local_418._8_4_) + 1.0;
                            if (local_3d0 < 0x7fffffff) {
                              local_2c0 = (long)(int)uVar98;
                              local_3d8 = CONCAT44(local_3d8._4_4_,(float)(int)uVar41);
                              scanline = pfVar58 + local_2c0;
                              local_318 = scanline + 1;
                              local_2b0 = local_2c0 * 4;
                              fVar102 = (float)(int)uVar98;
                              local_2b8 = (long)(int)(uVar52 + 2) << 2;
                              local_348 = 0;
                              uVar83 = 0;
                              local_4a8 = (undefined8 *)0x0;
                              iVar74 = 0;
                              psVar96 = (stbtt__active_edge *)0x0;
                              psVar68 = (stbtt__active_edge *)0x0;
                              psVar81 = psVar57;
                              fVar104 = (float)local_418._8_4_;
                              local_2e0 = psVar57;
                              do {
                                fVar114 = (float)(int)fVar104;
                                fVar99 = fVar114 + 1.0;
                                local_418._8_4_ = fVar104;
                                local_2a8 = uVar83;
                                memset(pfVar58,0,local_2b0);
                                memset(scanline,0,local_2b8);
                                if (psVar68 != (stbtt__active_edge *)0x0) {
                                  psVar59 = (stbtt__active_edge *)local_418;
                                  do {
                                    psVar60 = psVar68;
                                    if (psVar68->ey <= fVar114) {
                                      psVar59->next = psVar68->next;
                                      if ((psVar68->direction == 0.0) && (!NAN(psVar68->direction)))
                                      {
                                        __assert_fail("z->direction",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x83b,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                      }
                                      psVar68->direction = 0.0;
                                      psVar68->next = psVar96;
                                      psVar60 = psVar59;
                                      psVar96 = psVar68;
                                    }
                                    psVar68 = psVar60->next;
                                    psVar59 = psVar60;
                                  } while (psVar68 != (stbtt__active_edge *)0x0);
                                }
                                fVar104 = psVar81->y0;
                                while (psVar68 = (stbtt__active_edge *)local_418._0_8_,
                                      fVar104 <= fVar99) {
                                  fVar103 = psVar81->y1;
                                  if ((fVar104 != fVar103) || (NAN(fVar104) || NAN(fVar103))) {
                                    if (psVar96 == (stbtt__active_edge *)0x0) {
                                      if (iVar74 == 0) {
                                        puVar61 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                        if (puVar61 == (undefined8 *)0x0) goto LAB_00144211;
                                        *puVar61 = local_4a8;
                                        psVar96 = (stbtt__active_edge *)(puVar61 + 0xc7c);
                                        fVar104 = psVar81->y0;
                                        fVar103 = psVar81->y1;
                                        iVar74 = 799;
                                        psVar68 = (stbtt__active_edge *)0x0;
                                        local_4a8 = puVar61;
                                      }
                                      else {
                                        if (local_4a8 == (undefined8 *)0x0) {
LAB_00144211:
                                          __assert_fail("z != __null",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x6ab,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                        }
                                        lVar78 = (long)iVar74;
                                        iVar74 = iVar74 + -1;
                                        psVar96 = (stbtt__active_edge *)
                                                  (local_4a8 + lVar78 * 4 + -4);
                                        psVar68 = (stbtt__active_edge *)0x0;
                                      }
                                    }
                                    else {
                                      psVar68 = psVar96->next;
                                    }
                                    fVar112 = psVar81->x0;
                                    fVar124 = (psVar81->x1 - fVar112) / (fVar103 - fVar104);
                                    psVar96->fdx = fVar124;
                                    psVar96->fdy = (float)(-(uint)(fVar124 != 0.0) &
                                                          (uint)(1.0 / fVar124));
                                    psVar96->fx = ((fVar114 - fVar104) * fVar124 + fVar112) -
                                                  (float)local_3d8;
                                    psVar96->direction =
                                         *(float *)(&DAT_00166bec +
                                                   (ulong)(psVar81->invert == 0) * 4);
                                    psVar96->sy = fVar104;
                                    psVar96->ey = fVar103;
                                    psVar96->next = (stbtt__active_edge *)0x0;
                                    if (fVar103 < fVar114) {
                                      __assert_fail("z->ey >= scan_y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x848,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    psVar96->next = (stbtt__active_edge *)local_418._0_8_;
                                    local_418._0_8_ = psVar96;
                                    psVar96 = psVar68;
                                  }
                                  psVar57 = psVar81 + 1;
                                  psVar81 = psVar81 + 1;
                                  fVar104 = psVar57->y0;
                                }
                                for (; psVar57 = local_2e0, psVar68 != (stbtt__active_edge *)0x0;
                                    psVar68 = psVar68->next) {
                                  fVar104 = psVar68->ey;
                                  if (fVar104 < fVar114) {
                                    __assert_fail("e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x77f,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar103 = psVar68->fx;
                                  auVar132._0_8_ = CONCAT44(0,fVar103);
                                  auVar132._8_8_ = 0;
                                  fVar112 = psVar68->fdx;
                                  if ((fVar112 != 0.0) || (NAN(fVar112))) {
                                    fVar124 = psVar68->sy;
                                    if (fVar99 < fVar124) {
                                      __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x792,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    fVar133 = fVar112 + fVar103;
                                    fVar130 = (float)(~-(uint)(fVar114 < fVar124) & (uint)fVar103 |
                                                     (uint)((fVar124 - fVar114) * fVar112 + fVar103)
                                                     & -(uint)(fVar114 < fVar124));
                                    if ((((fVar130 < 0.0) ||
                                         (fVar125 = (float)(~-(uint)(fVar104 < fVar99) &
                                                            (uint)fVar133 |
                                                           (uint)((fVar104 - fVar114) * fVar112 +
                                                                 fVar103) &
                                                           -(uint)(fVar104 < fVar99)), fVar125 < 0.0
                                         )) || (fVar102 <= fVar130)) || (fVar102 <= fVar125)) {
                                      if (uVar52 < 0x7fffffff) {
                                        local_388 = auVar132;
                                        uVar51 = 0;
                                        do {
                                          fVar103 = (float)(int)uVar51;
                                          uVar53 = uVar51 + 1;
                                          fVar130 = (float)(int)uVar53;
                                          fVar104 = local_388._0_4_;
                                          fVar124 = (fVar103 - fVar104) / fVar112 + fVar114;
                                          fVar125 = (fVar130 - fVar104) / fVar112 + fVar114;
                                          if ((fVar103 <= fVar104) || (fVar133 <= fVar130)) {
                                            if ((fVar103 <= fVar133) || (fVar104 <= fVar130)) {
                                              fVar126 = fVar114;
                                              if (((fVar103 <= fVar104) || (fVar133 <= fVar103)) &&
                                                 ((fVar103 <= fVar133 || (fVar104 <= fVar103)))) {
                                                fVar124 = fVar114;
                                                if (((fVar104 < fVar130) && (fVar130 < fVar133)) ||
                                                   ((fVar103 = fVar104, fVar133 < fVar130 &&
                                                    (fVar130 < fVar104)))) goto LAB_001430ed;
                                                goto LAB_001431a5;
                                              }
                                            }
                                            else {
                                              stbtt__handle_clipped_edge
                                                        (pfVar58,uVar51,psVar68,fVar104,fVar114,
                                                         fVar130,fVar125);
                                              fVar104 = fVar130;
                                              fVar126 = fVar125;
                                            }
                                            stbtt__handle_clipped_edge
                                                      (pfVar58,uVar51,psVar68,fVar104,fVar126,
                                                       fVar103,fVar124);
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      (pfVar58,uVar51,psVar68,fVar104,fVar114,
                                                       fVar103,fVar124);
                                            fVar104 = fVar103;
LAB_001430ed:
                                            stbtt__handle_clipped_edge
                                                      (pfVar58,uVar51,psVar68,fVar104,fVar124,
                                                       fVar130,fVar125);
                                            fVar103 = fVar130;
                                            fVar124 = fVar125;
                                          }
LAB_001431a5:
                                          stbtt__handle_clipped_edge
                                                    (pfVar58,uVar51,psVar68,fVar103,fVar124,fVar133,
                                                     fVar99);
                                          uVar51 = uVar53;
                                        } while (uVar98 != uVar53);
                                      }
                                    }
                                    else {
                                      if (fVar124 <= fVar114) {
                                        fVar124 = fVar114;
                                      }
                                      uVar51 = (uint)fVar130;
                                      if (fVar99 <= fVar104) {
                                        fVar104 = fVar99;
                                      }
                                      uVar53 = (uint)fVar125;
                                      if (uVar51 == uVar53) {
                                        if (((int)uVar51 < 0) || ((int)uVar98 <= (int)uVar51)) {
                                          __assert_fail("x >= 0 && x < len",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x7ae,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar83 = (ulong)uVar51;
                                        pfVar58[uVar83] =
                                             (((fVar125 - (float)(int)uVar51) +
                                              (fVar130 - (float)(int)uVar51)) * -0.5 + 1.0) *
                                             psVar68->direction * (fVar104 - fVar124) +
                                             pfVar58[uVar83];
                                        fVar103 = (fVar104 - fVar124) * psVar68->direction;
                                      }
                                      else {
                                        fVar112 = psVar68->fdy;
                                        uVar95 = uVar51;
                                        fVar126 = fVar130;
                                        if (fVar125 < fVar130) {
                                          fVar126 = fVar114 - fVar124;
                                          fVar124 = (fVar114 - fVar104) + fVar99;
                                          fVar112 = -fVar112;
                                          fVar103 = fVar133;
                                          uVar95 = uVar53;
                                          uVar53 = uVar51;
                                          fVar104 = fVar126 + fVar99;
                                          fVar126 = fVar125;
                                          fVar125 = fVar130;
                                        }
                                        iVar77 = uVar95 + 1;
                                        fVar133 = ((float)iVar77 - fVar103) * fVar112 + fVar114;
                                        fVar103 = psVar68->direction;
                                        fVar130 = (fVar133 - fVar124) * fVar103;
                                        lVar78 = (long)(int)uVar95;
                                        pfVar58[lVar78] =
                                             (((fVar126 - (float)(int)uVar95) + 1.0) * -0.5 + 1.0) *
                                             fVar130 + pfVar58[lVar78];
                                        if (uVar53 - iVar77 != 0 && iVar77 <= (int)uVar53) {
                                          do {
                                            pfVar58[lVar78 + 1] =
                                                 fVar112 * fVar103 * 0.5 + fVar130 +
                                                 pfVar58[lVar78 + 1];
                                            fVar130 = fVar130 + fVar112 * fVar103;
                                            lVar78 = lVar78 + 1;
                                          } while (uVar53 - 1 != (int)lVar78);
                                        }
                                        if (1.01 < ABS(fVar130)) {
                                          __assert_fail("fabs(area) <= 1.01f",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x7d3,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar83 = (ulong)(int)uVar53;
                                        pfVar58[uVar83] =
                                             (fVar104 -
                                             (fVar112 * (float)(int)(uVar53 - iVar77) + fVar133)) *
                                             (((fVar125 - (float)(int)uVar53) + 0.0) * -0.5 + 1.0) *
                                             fVar103 + fVar130 + pfVar58[uVar83];
                                        fVar103 = (fVar104 - fVar124) * fVar103;
                                      }
                                      local_318[uVar83] = fVar103 + local_318[uVar83];
                                    }
                                  }
                                  else if (fVar103 < fVar102) {
                                    if (0.0 <= fVar103) {
                                      local_388 = auVar132;
                                      stbtt__handle_clipped_edge
                                                (pfVar58,(int)fVar103,psVar68,fVar103,fVar114,
                                                 fVar103,fVar99);
                                      iVar77 = (int)fVar103 + 1;
                                      auVar121 = local_388;
                                    }
                                    else {
                                      iVar77 = 0;
                                      auVar121._8_8_ = 0;
                                      auVar121._0_8_ = auVar132._0_8_;
                                    }
                                    stbtt__handle_clipped_edge
                                              (scanline,iVar77,psVar68,auVar121._0_4_,fVar114,
                                               auVar121._0_4_,fVar99);
                                  }
                                }
                                auVar117._0_12_ = ZEXT812(0x437f0000);
                                auVar117._12_4_ = 0;
                                psVar68 = (stbtt__active_edge *)local_418._0_8_;
                                if (uVar52 < 0x7fffffff) {
                                  fVar104 = 0.0;
                                  pfVar62 = pfVar58;
                                  uVar83 = local_348;
                                  lVar78 = local_2c0;
                                  do {
                                    fVar104 = fVar104 + pfVar62[local_2c0];
                                    iVar77 = (int)(ABS(*pfVar62 + fVar104) * 255.0 + 0.5);
                                    uVar76 = (uchar)iVar77;
                                    if (0xfe < iVar77) {
                                      uVar76 = 0xff;
                                    }
                                    local_308[(int)uVar83] = uVar76;
                                    uVar83 = (ulong)((int)uVar83 + 1);
                                    pfVar62 = pfVar62 + 1;
                                    lVar78 = lVar78 + -1;
                                  } while (lVar78 != 0);
                                }
                                for (; psVar68 != (stbtt__active_edge *)0x0; psVar68 = psVar68->next
                                    ) {
                                  psVar68->fx = psVar68->fdx + psVar68->fx;
                                }
                                fVar104 = (float)(local_418._8_4_ + 1);
                                uVar83 = (ulong)((uint)local_2a8 + 1);
                                local_348 = (ulong)((int)local_348 + local_3cc);
                                psVar68 = (stbtt__active_edge *)local_418._0_8_;
                              } while ((uint)local_2a8 != local_3d0);
                              pvVar56 = (void *)local_408._0_8_;
                              while (local_4a8 != (undefined8 *)0x0) {
                                puVar61 = (undefined8 *)*local_4a8;
                                ImGui::MemFree(local_4a8);
                                local_4a8 = puVar61;
                              }
                            }
                            if (pfVar58 != (float *)&local_238) {
                              ImGui::MemFree(pfVar58);
                            }
                            ImGui::MemFree(psVar57);
                          }
                          ImGui::MemFree(local_3f8);
                          ImGui::MemFree(pvVar56);
                        }
                      }
                    }
                  }
                }
LAB_0014355a:
                ImGui::MemFree((void *)CONCAT44(local_3c8._4_4_,(int)local_3c8));
                uVar51 = local_3c0.h_oversample;
                uVar67 = local_3c0._32_8_ & 0xffffffff;
                uVar91 = (ulong)*(ushort *)(local_338 + 8);
                uVar42 = *(ushort *)(local_338 + 10);
                uVar52 = (uint)*(ushort *)(local_338 + 4);
                uVar113 = *(ushort *)(local_338 + 6);
                if (1 < uVar67) {
                  lVar78 = (long)local_3c0.stride_in_bytes;
                  local_238 = 0;
                  uVar98 = 0;
                  if (uVar113 == 0) {
                    uVar113 = 0;
                  }
                  else {
                    uVar53 = (uint)*(ushort *)(local_338 + 4);
                    puVar55 = local_3c0.pixels +
                              (ulong)uVar42 * lVar78 + (ulong)*(ushort *)(local_338 + 8);
                    iVar74 = uVar53 - local_3c0.h_oversample;
                    uVar52 = iVar74 + 1;
                    uVar83 = (ulong)uVar52;
                    do {
                      memset(&local_238,0,uVar67);
                      uVar95 = uVar52;
                      switch(uVar51) {
                      case 2:
                        if (iVar74 < 0) {
LAB_00143789:
                          uVar65 = 0;
                          uVar95 = 0;
                        }
                        else {
                          uVar91 = 0;
                          uVar65 = 0;
                          do {
                            bVar101 = puVar55[uVar91];
                            bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar91 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar91 + 2 & 7)) = bVar101;
                            uVar65 = uVar65 + ((uint)bVar101 - (uint)bVar9);
                            puVar55[uVar91] = (uchar)(uVar65 >> 1);
                            uVar91 = uVar91 + 1;
                          } while (uVar83 != uVar91);
                        }
                        break;
                      case 3:
                        if (iVar74 < 0) goto LAB_00143789;
                        uVar91 = 0;
                        uVar65 = 0;
                        do {
                          bVar101 = puVar55[uVar91];
                          bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar91 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar91 + 3 & 7)) = bVar101;
                          uVar65 = uVar65 + ((uint)bVar101 - (uint)bVar9);
                          puVar55[uVar91] = (uchar)(uVar65 / 3);
                          uVar91 = uVar91 + 1;
                        } while (uVar83 != uVar91);
                        break;
                      case 4:
                        if (iVar74 < 0) goto LAB_00143789;
                        uVar91 = 0;
                        uVar65 = 0;
                        do {
                          bVar101 = puVar55[uVar91];
                          uVar82 = (ulong)((uint)uVar91 & 7);
                          *(byte *)((long)&local_238 + (uVar82 ^ 4)) = bVar101;
                          uVar65 = uVar65 + ((uint)bVar101 -
                                            (uint)*(byte *)((long)&local_238 + uVar82));
                          puVar55[uVar91] = (uchar)(uVar65 >> 2);
                          uVar91 = uVar91 + 1;
                        } while (uVar83 != uVar91);
                        break;
                      case 5:
                        if (iVar74 < 0) goto LAB_00143789;
                        uVar91 = 0;
                        uVar65 = 0;
                        do {
                          bVar101 = puVar55[uVar91];
                          bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar91 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar91 + 5 & 7)) = bVar101;
                          uVar65 = uVar65 + ((uint)bVar101 - (uint)bVar9);
                          puVar55[uVar91] = (uchar)(uVar65 / 5);
                          uVar91 = uVar91 + 1;
                        } while (uVar83 != uVar91);
                        break;
                      default:
                        if (iVar74 < 0) goto LAB_00143789;
                        uVar91 = 0;
                        uVar65 = 0;
                        do {
                          bVar101 = puVar55[uVar91];
                          bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar91 & 7));
                          *(byte *)((long)&local_238 + (ulong)(uVar51 + (uint)uVar91 & 7)) = bVar101
                          ;
                          uVar65 = uVar65 + ((uint)bVar101 - (uint)bVar9);
                          puVar55[uVar91] = (uchar)(uVar65 / uVar51);
                          uVar91 = uVar91 + 1;
                        } while (uVar83 != uVar91);
                      }
                      if ((int)uVar95 < (int)uVar53) {
                        uVar91 = (ulong)uVar95;
                        do {
                          if (puVar55[uVar91] != '\0') {
                            __assert_fail("pixels[i] == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                          ,0xada,
                                          "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar65 = uVar65 - *(byte *)((long)&local_238 + (ulong)((uint)uVar91 & 7));
                          puVar55[uVar91] = (uchar)(uVar65 / uVar51);
                          uVar91 = uVar91 + 1;
                        } while ((int)uVar91 < (int)uVar53);
                      }
                      puVar55 = puVar55 + lVar78;
                      uVar98 = uVar98 + 1;
                    } while (uVar98 != uVar113);
                    uVar91 = (ulong)*(ushort *)(local_338 + 8);
                    uVar42 = *(ushort *)(local_338 + 10);
                    uVar52 = (uint)*(ushort *)(local_338 + 4);
                    uVar113 = *(ushort *)(local_338 + 6);
                  }
                }
                sVar119 = (short)uVar91;
                uVar51 = local_3c0.v_oversample;
                uVar83 = (ulong)local_3c0.v_oversample;
                if (1 < uVar83) {
                  lVar78 = (long)local_3c0.stride_in_bytes;
                  local_238 = 0;
                  uVar98 = 0;
                  if ((short)uVar52 == 0) {
                    uVar52 = 0;
                  }
                  else {
                    pbVar94 = local_3c0.pixels + (ulong)uVar42 * lVar78 + uVar91;
                    uVar53 = (uint)uVar113;
                    iVar74 = uVar53 - local_3c0.v_oversample;
                    uVar95 = iVar74 + 1;
                    uVar91 = (ulong)uVar95;
                    do {
                      memset(&local_238,0,uVar83);
                      uVar65 = uVar95;
                      switch(uVar51) {
                      case 2:
                        if (iVar74 < 0) {
LAB_00143a21:
                          uVar66 = 0;
                          uVar65 = 0;
                        }
                        else {
                          uVar82 = 0;
                          uVar66 = 0;
                          pbVar85 = pbVar94;
                          do {
                            bVar101 = *pbVar85;
                            bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar82 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar82 + 2 & 7)) = bVar101;
                            uVar66 = uVar66 + ((uint)bVar101 - (uint)bVar9);
                            *pbVar85 = (byte)(uVar66 >> 1);
                            uVar82 = uVar82 + 1;
                            pbVar85 = pbVar85 + lVar78;
                          } while (uVar91 != uVar82);
                        }
                        break;
                      case 3:
                        if (iVar74 < 0) goto LAB_00143a21;
                        uVar82 = 0;
                        uVar66 = 0;
                        pbVar85 = pbVar94;
                        do {
                          bVar101 = *pbVar85;
                          bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar82 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar82 + 3 & 7)) = bVar101;
                          uVar66 = uVar66 + ((uint)bVar101 - (uint)bVar9);
                          *pbVar85 = (byte)(uVar66 / 3);
                          uVar82 = uVar82 + 1;
                          pbVar85 = pbVar85 + lVar78;
                        } while (uVar91 != uVar82);
                        break;
                      case 4:
                        if (iVar74 < 0) goto LAB_00143a21;
                        uVar82 = 0;
                        uVar66 = 0;
                        pbVar85 = pbVar94;
                        do {
                          bVar101 = *pbVar85;
                          uVar84 = (ulong)((uint)uVar82 & 7);
                          *(byte *)((long)&local_238 + (uVar84 ^ 4)) = bVar101;
                          uVar66 = uVar66 + ((uint)bVar101 -
                                            (uint)*(byte *)((long)&local_238 + uVar84));
                          *pbVar85 = (byte)(uVar66 >> 2);
                          uVar82 = uVar82 + 1;
                          pbVar85 = pbVar85 + lVar78;
                        } while (uVar91 != uVar82);
                        break;
                      case 5:
                        if (iVar74 < 0) goto LAB_00143a21;
                        uVar82 = 0;
                        uVar66 = 0;
                        pbVar85 = pbVar94;
                        do {
                          bVar101 = *pbVar85;
                          bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar82 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar82 + 5 & 7)) = bVar101;
                          uVar66 = uVar66 + ((uint)bVar101 - (uint)bVar9);
                          *pbVar85 = (byte)(uVar66 / 5);
                          uVar82 = uVar82 + 1;
                          pbVar85 = pbVar85 + lVar78;
                        } while (uVar91 != uVar82);
                        break;
                      default:
                        if (iVar74 < 0) goto LAB_00143a21;
                        uVar82 = 0;
                        uVar66 = 0;
                        pbVar85 = pbVar94;
                        do {
                          bVar101 = *pbVar85;
                          bVar9 = *(byte *)((long)&local_238 + (ulong)((uint)uVar82 & 7));
                          *(byte *)((long)&local_238 + (ulong)(uVar51 + (uint)uVar82 & 7)) = bVar101
                          ;
                          uVar66 = uVar66 + ((uint)bVar101 - (uint)bVar9);
                          *pbVar85 = (byte)(uVar66 / uVar51);
                          uVar82 = uVar82 + 1;
                          pbVar85 = pbVar85 + lVar78;
                        } while (uVar91 != uVar82);
                      }
                      iVar77 = uVar53 - uVar65;
                      if (iVar77 != 0 && (int)uVar65 <= (int)uVar53) {
                        lVar71 = (long)(int)uVar65;
                        pbVar85 = pbVar94 + lVar78 * lVar71;
                        do {
                          if (*pbVar85 != 0) {
                            __assert_fail("pixels[i*stride_in_bytes] == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                          ,0xb18,
                                          "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar66 = uVar66 - *(byte *)((long)&local_238 + (ulong)((uint)lVar71 & 7));
                          *pbVar85 = (byte)(uVar66 / uVar51);
                          lVar71 = lVar71 + 1;
                          pbVar85 = pbVar85 + lVar78;
                          iVar77 = iVar77 + -1;
                        } while (iVar77 != 0);
                      }
                      pbVar94 = pbVar94 + 1;
                      uVar98 = uVar98 + 1;
                    } while (uVar98 != uVar52);
                    sVar119 = *(short *)(local_338 + 8);
                    uVar42 = *(ushort *)(local_338 + 10);
                    uVar52 = (uint)*(ushort *)(local_338 + 4);
                    uVar113 = *(ushort *)(local_338 + 6);
                  }
                }
                *local_2a0 = sVar119;
                local_2a0[1] = uVar42;
                local_2a0[2] = sVar119 + (short)uVar52;
                local_2a0[3] = uVar113 + uVar42;
                *(float *)(local_2a0 + 8) =
                     (float)(int)(short)((short)(local_328 << 8) + (short)local_32c) * local_2f8;
                *(ulong *)(local_2a0 + 4) =
                     CONCAT44((float)local_324 * local_258._4_4_ + local_248._4_4_,
                              (float)local_320 * local_258._0_4_ + local_248._0_4_);
                *(float *)(local_2a0 + 10) =
                     (float)(int)(uVar52 + local_320) * local_258._0_4_ + local_248._0_4_;
                *(float *)(local_2a0 + 0xc) =
                     (float)(int)((uint)uVar113 + local_324) * (float)local_268._0_4_ + local_278;
                iVar74 = *(int *)(local_340 + 0x10);
                lVar80 = local_298;
                lVar86 = local_300;
                lVar78 = local_310;
                lVar72 = local_340;
              }
              lVar80 = lVar80 + 1;
              lVar86 = lVar86 + 1;
              lVar71 = local_2d8;
              lVar92 = local_2c8;
            } while (lVar86 < iVar74);
          }
          lVar92 = lVar92 + 1;
        } while (lVar92 != local_2d0);
      }
      local_3c0.h_oversample = (undefined4)local_288;
      local_3c0.v_oversample = local_288._4_4_;
      local_3e0[1].userdata = (void *)0x0;
      lVar78 = local_2e8 + 1;
      uVar83 = local_288;
    } while (lVar78 < (this->ConfigData).Size);
  }
  ImGui::MemFree(local_3c0.nodes);
  ImGui::MemFree(local_3c0.pack_info);
  ImGui::MemFree(local_350);
  if (0 < (this->ConfigData).Size) {
    lVar78 = 0;
    local_3f8 = (void *)0x3f8000003f800000;
    uStack_3f0 = 0x3f8000003f800000;
    do {
      pIVar90 = (this->ConfigData).Data;
      pIVar10 = pIVar90 + lVar78;
      lVar92 = lVar78 * 0x50;
      pIVar11 = pIVar90[lVar78].DstFont;
      fVar104 = pIVar90[lVar78].SizePixels;
      lVar71 = *(long *)((long)ptr + lVar92 + 8);
      lVar80 = (long)*(int *)((long)ptr + lVar92 + 0x24);
      uVar52 = (int)(short)((ushort)*(byte *)(lVar71 + 4 + lVar80) << 8) |
               (uint)*(byte *)(lVar71 + 5 + lVar80);
      uVar51 = (int)(short)((ushort)*(byte *)(lVar71 + 6 + lVar80) << 8) |
               (uint)*(byte *)(lVar71 + 7 + lVar80);
      fVar102 = fVar104 / (float)(int)(uVar52 - uVar51);
      fVar114 = (float)(int)uVar52 * fVar102;
      bVar101 = pIVar90[lVar78].MergeMode;
      if ((bool)bVar101 == false) {
        pIVar11->ContainerAtlas = this;
        pIVar11->ConfigData = pIVar10;
        pIVar11->ConfigDataCount = 0;
        pIVar11->FontSize = fVar104;
        pIVar11->Ascent = fVar114;
        pIVar11->Descent = fVar102 * (float)(int)(short)uVar51;
        if ((pIVar11->Glyphs).Capacity < 0) {
          pGVar63 = (Glyph *)ImGui::MemAlloc(0);
          pGVar69 = (pIVar11->Glyphs).Data;
          if (pGVar69 == (Glyph *)0x0) {
            pGVar69 = (Glyph *)0x0;
          }
          else {
            memcpy(pGVar63,pGVar69,(long)(pIVar11->Glyphs).Size * 0x28);
            pGVar69 = (pIVar11->Glyphs).Data;
          }
          ImGui::MemFree(pGVar69);
          (pIVar11->Glyphs).Data = pGVar63;
          (pIVar11->Glyphs).Capacity = 0;
          bVar101 = pIVar10->MergeMode;
        }
        (pIVar11->Glyphs).Size = 0;
      }
      pIVar11->ConfigDataCount = pIVar11->ConfigDataCount + 1;
      local_4ac = 0.0;
      if (((bVar101 & 1) != 0) && (pIVar10->MergeGlyphCenterV == true)) {
        local_4ac = (fVar114 - pIVar11->Ascent) * 0.5;
      }
      pIVar11->FallbackGlyph = (Glyph *)0x0;
      iVar74 = *(int *)((long)ptr + lVar92 + 0x48);
      if (0 < iVar74) {
        lVar71 = 0;
        do {
          lVar80 = *(long *)((long)ptr + lVar92 + 0x40);
          if (0 < *(int *)(lVar80 + 0x10 + lVar71 * 0x28)) {
            lVar80 = lVar80 + lVar71 * 0x28;
            lVar86 = 0;
            lVar72 = 0;
            local_3d8 = lVar80;
            do {
              lVar15 = *(long *)(lVar80 + 0x18);
              uVar42 = *(ushort *)(lVar15 + lVar86);
              if ((((uVar42 != 0) || (*(short *)(lVar15 + 4 + lVar86) != 0)) ||
                  (*(short *)(lVar15 + 2 + lVar86) != 0)) || (*(short *)(lVar15 + 6 + lVar86) != 0))
              {
                uVar51 = *(uint *)(lVar80 + 4);
                if (pIVar10->MergeMode == true) {
                  uVar83 = (ulong)uVar51 + lVar72 & 0xffff;
                  if (((int)uVar83 < (pIVar11->IndexLookup).Size) &&
                     (uVar113 = (pIVar11->IndexLookup).Data[uVar83], uVar113 != 0xffff)) {
                    pGVar69 = (Glyph *)((long)&((pIVar11->Glyphs).Data)->Codepoint +
                                       (ulong)((uint)uVar113 * 0x28));
                  }
                  else {
                    pGVar69 = pIVar11->FallbackGlyph;
                  }
                  if (pGVar69 != (Glyph *)0x0) goto LAB_0014407d;
                }
                fVar104 = *(float *)(lVar15 + 8 + lVar86);
                fVar102 = *(float *)(lVar15 + 0xc + lVar86);
                fVar114 = *(float *)(lVar15 + 0x14 + lVar86);
                fVar99 = *(float *)(lVar15 + 0x18 + lVar86);
                local_408 = ZEXT416(*(uint *)(lVar15 + 4 + lVar86));
                uVar3 = this->TexWidth;
                uVar8 = this->TexHeight;
                local_388._4_4_ = uVar8;
                local_388._0_4_ = uVar3;
                local_388._8_8_ = 0;
                uVar1 = *(undefined2 *)(lVar15 + 2 + lVar86);
                iVar74 = (pIVar11->Glyphs).Size;
                iVar77 = (pIVar11->Glyphs).Capacity;
                uVar52 = iVar74 + 1;
                if (iVar77 <= iVar74) {
                  if (iVar77 == 0) {
                    uVar98 = 8;
                  }
                  else {
                    uVar98 = iVar77 / 2 + iVar77;
                  }
                  if ((int)uVar98 <= (int)uVar52) {
                    uVar98 = uVar52;
                  }
                  pGVar63 = (Glyph *)ImGui::MemAlloc((long)(int)uVar98 * 0x28);
                  pGVar69 = (pIVar11->Glyphs).Data;
                  if (pGVar69 == (Glyph *)0x0) {
                    pGVar69 = (Glyph *)0x0;
                  }
                  else {
                    memcpy(pGVar63,pGVar69,(long)(pIVar11->Glyphs).Size * 0x28);
                    pGVar69 = (pIVar11->Glyphs).Data;
                  }
                  ImGui::MemFree(pGVar69);
                  (pIVar11->Glyphs).Data = pGVar63;
                  (pIVar11->Glyphs).Capacity = uVar98;
                  lVar80 = local_3d8;
                }
                (pIVar11->Glyphs).Size = uVar52;
                if (iVar74 < 0) {
                  __assert_fail("Size > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                                ,0x365,
                                "value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]");
                }
                auVar107._0_8_ = CONCAT44((float)(int)local_388._4_4_,(float)(int)local_388._0_4_);
                auVar107._8_8_ = auVar107._0_8_;
                auVar26._8_8_ = uStack_3f0;
                auVar26._0_8_ = local_3f8;
                auVar117 = divps(auVar26,auVar107);
                auVar108._12_4_ = local_408._4_4_;
                auVar108._0_12_ = ZEXT412(0);
                auVar35._4_8_ = auVar108._8_8_;
                auVar35._0_4_ = local_408._0_4_;
                auVar39._10_2_ = 0;
                auVar39._0_10_ = auVar35._0_10_ << 0x20;
                auVar39._12_2_ = local_408._2_2_;
                Var32 = CONCAT46(auVar39._10_4_,CONCAT24(local_408._0_2_,local_408._0_4_));
                auVar36._2_10_ = SUB1610(ZEXT616((uint6)((unkuint10)Var32 >> 0x20)) << 0x40,6);
                auVar36._0_2_ = uVar1;
                pGVar69 = (pIVar11->Glyphs).Data;
                pGVar69[(ulong)uVar52 - 1].Codepoint = (short)uVar51 + (short)lVar72;
                pGVar69[(ulong)uVar52 - 1].X0 = fVar104 + 0.0;
                pGVar69[(ulong)uVar52 - 1].X1 = fVar114 + 0.0;
                pfVar58 = &pGVar69[(ulong)uVar52 - 1].U0;
                *pfVar58 = (float)uVar42 * auVar117._0_4_;
                pfVar58[1] = (float)auVar36._0_4_ * auVar117._4_4_;
                pfVar58[2] = (float)(int)((unkuint10)Var32 >> 0x20) * auVar117._8_4_;
                pfVar58[3] = (float)local_408._2_2_ * auVar117._12_4_;
                fVar104 = (float)(int)(pIVar11->Ascent + local_4ac + 0.5);
                pGVar69[(ulong)uVar52 - 1].Y0 = fVar102 + 0.0 + fVar104;
                pGVar69[(ulong)uVar52 - 1].Y1 = fVar99 + 0.0 + fVar104;
                fVar104 = *(float *)(lVar15 + 0x10 + lVar86) + (pIVar10->GlyphExtraSpacing).x;
                pGVar69[(ulong)uVar52 - 1].XAdvance = fVar104;
                if (pIVar10->PixelSnapH == true) {
                  pGVar69[(ulong)uVar52 - 1].XAdvance = (float)(int)(fVar104 + 0.5);
                }
              }
LAB_0014407d:
              lVar72 = lVar72 + 1;
              lVar86 = lVar86 + 0x1c;
            } while (lVar72 < *(int *)(lVar80 + 0x10));
            iVar74 = *(int *)((long)ptr + lVar92 + 0x48);
          }
          lVar71 = lVar71 + 1;
        } while (lVar71 < iVar74);
      }
      ImFont::BuildLookupTable(pIVar10->DstFont);
      lVar78 = lVar78 + 1;
    } while (lVar78 < (this->ConfigData).Size);
  }
  ImGui::MemFree(local_358);
  ImGui::MemFree(local_360);
  ImGui::MemFree(ptr);
  RenderCustomTexData(this,1,&local_378);
  ImVector<stbrp_rect>::~ImVector(&local_378);
  return true;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}